

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_PhysicallyBasedMaterialUserData::Parameters::Write
          (Parameters *this,ON_BinaryArchive *binary_archive,int version)

{
  bool bVar1;
  
  bVar1 = ON_BinaryArchive::WriteColor(binary_archive,&this->base_color);
  if ((((((((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(binary_archive,this->brdf), bVar1)) &&
          (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->subsurface), bVar1)) &&
         ((bVar1 = ON_BinaryArchive::WriteColor(binary_archive,&this->subsurface_scattering_color),
          bVar1 && (bVar1 = ON_BinaryArchive::WriteDouble
                                      (binary_archive,this->subsurface_scattering_radius), bVar1))))
        && ((bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->metallic), bVar1 &&
            ((bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->specular), bVar1 &&
             (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->specular_tint), bVar1))))))
       && ((bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->roughness), bVar1 &&
           (((bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->anisotropic), bVar1 &&
             (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->anisotropic_rotation),
             bVar1)) && (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->sheen), bVar1)))
           ))) &&
      ((((bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->sheen_tint), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->clearcoat), bVar1)) &&
        ((bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->clearcoat_roughness), bVar1 &&
         ((bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->opacity_IOR), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->opacity), bVar1)))))) &&
       (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->opacity_roughness), bVar1)))) &&
     ((bVar1 = ON_BinaryArchive::WriteColor(binary_archive,&this->emission), bVar1 &&
      ((version < 2 || (bVar1 = ON_BinaryArchive::WriteDouble(binary_archive,this->alpha), bVar1))))
     )) {
    return true;
  }
  return false;
}

Assistant:

bool Write(ON_BinaryArchive& binary_archive, int version) const
    {
      if (!binary_archive.WriteColor(base_color)) return false;
      if (!binary_archive.WriteInt((int)brdf)) return false;
      if (!binary_archive.WriteDouble(subsurface)) return false;
      if (!binary_archive.WriteColor(subsurface_scattering_color)) return false;
      if (!binary_archive.WriteDouble(subsurface_scattering_radius)) return false;
      if (!binary_archive.WriteDouble(metallic)) return false;
      if (!binary_archive.WriteDouble(specular)) return false;
      if (!binary_archive.WriteDouble(specular_tint)) return false;
      if (!binary_archive.WriteDouble(roughness)) return false;
      if (!binary_archive.WriteDouble(anisotropic)) return false;
      if (!binary_archive.WriteDouble(anisotropic_rotation)) return false;
      if (!binary_archive.WriteDouble(sheen)) return false;
      if (!binary_archive.WriteDouble(sheen_tint)) return false;
      if (!binary_archive.WriteDouble(clearcoat)) return false;
      if (!binary_archive.WriteDouble(clearcoat_roughness)) return false;
      if (!binary_archive.WriteDouble(opacity_IOR)) return false;
      if (!binary_archive.WriteDouble(opacity)) return false;
      if (!binary_archive.WriteDouble(opacity_roughness)) return false;
      if (!binary_archive.WriteColor(emission)) return false;

      if (version >= 2)
      {
        if (!binary_archive.WriteDouble(alpha)) return false;
      }

      return true;
    }